

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O1

CURLcode Curl_rtsp_parseheader(connectdata *conn,char *header)

{
  SessionHandle *data;
  int iVar1;
  ushort **ppuVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  byte bVar6;
  CURLcode CVar7;
  byte *__s1;
  byte *pbVar8;
  bool bVar9;
  long CSeq;
  long local_30;
  
  data = conn->data;
  local_30 = 0;
  iVar1 = Curl_raw_nequal("CSeq:",header,5);
  if (iVar1 != 0) {
    iVar1 = __isoc99_sscanf(header + 4,": %ld",&local_30);
    if (iVar1 == 1) {
      *(long *)((long)(data->req).protop + 0x90) = local_30;
      (data->state).rtsp_CSeq_recv = local_30;
      return CURLE_OK;
    }
    Curl_failf(data,"Unable to read the CSeq header: [%s]",header);
    return CURLE_RTSP_CSEQ_ERROR;
  }
  iVar1 = Curl_raw_nequal("Session:",header,8);
  if (iVar1 == 0) {
    return CURLE_OK;
  }
  bVar6 = header[8];
  bVar9 = (ulong)bVar6 == 0;
  if (bVar9) {
LAB_004924f1:
    Curl_failf(data,"Got a blank Session ID");
  }
  else {
    __s1 = (byte *)(header + 8);
    ppuVar2 = __ctype_b_loc();
    bVar6 = *(byte *)((long)*ppuVar2 + (ulong)bVar6 * 2 + 1);
    while ((bVar6 & 0x20) != 0) {
      pbVar8 = __s1 + 1;
      bVar9 = (ulong)*pbVar8 == 0;
      if (bVar9) goto LAB_004924f1;
      __s1 = __s1 + 1;
      bVar6 = *(byte *)((long)*ppuVar2 + (ulong)*pbVar8 * 2 + 1);
    }
    if (bVar9) goto LAB_004924f1;
    pcVar4 = (data->set).str[0x22];
    if (pcVar4 == (char *)0x0) {
      bVar6 = *__s1;
      pbVar8 = __s1;
      if (bVar6 != 0) {
        ppuVar2 = __ctype_b_loc();
        do {
          if (((*ppuVar2)[bVar6] & 8) == 0) {
            uVar5 = bVar6 - 0x2b;
            if (0x34 < uVar5) break;
            if ((0x1000000000000dU >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
              if (((ulong)uVar5 != 0x31) || (pbVar8[1] != 0x24)) break;
              pbVar8 = pbVar8 + 1;
            }
          }
          bVar6 = pbVar8[1];
          pbVar8 = pbVar8 + 1;
        } while (bVar6 != 0);
      }
      sVar3 = (long)pbVar8 - (long)__s1;
      pcVar4 = (char *)(*Curl_cmalloc)(sVar3 + 1);
      (data->set).str[0x22] = pcVar4;
      CVar7 = CURLE_OUT_OF_MEMORY;
      if (pcVar4 == (char *)0x0) {
        bVar9 = false;
      }
      else {
        memcpy(pcVar4,__s1,sVar3);
        (data->set).str[0x22][sVar3] = '\0';
        bVar9 = true;
      }
      goto LAB_0049250a;
    }
    sVar3 = strlen(pcVar4);
    iVar1 = strncmp((char *)__s1,pcVar4,sVar3);
    if (iVar1 != 0) {
      bVar9 = false;
      Curl_failf(data,"Got RTSP Session ID Line [%s], but wanted ID [%s]",__s1,pcVar4);
      CVar7 = CURLE_RTSP_SESSION_ERROR;
      goto LAB_0049250a;
    }
  }
  bVar9 = true;
  CVar7 = CURLE_OUT_OF_MEMORY;
LAB_0049250a:
  if (bVar9) {
    return CURLE_OK;
  }
  return CVar7;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct connectdata *conn,
                               char *header)
{
  struct SessionHandle *data = conn->data;
  long CSeq = 0;

  if(checkprefix("CSeq:", header)) {
    /* Store the received CSeq. Match is verified in rtsp_done */
    int nc = sscanf(&header[4], ": %ld", &CSeq);
    if(nc == 1) {
      struct RTSP *rtsp = data->req.protop;
      rtsp->CSeq_recv = CSeq; /* mark the request */
      data->state.rtsp_CSeq_recv = CSeq; /* update the handle */
    }
    else {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
  }
  else if(checkprefix("Session:", header)) {
    char *start;

    /* Find the first non-space letter */
    start = header + 8;
    while(*start && ISSPACE(*start))
      start++;

    if(!*start) {
      failf(data, "Got a blank Session ID");
    }
    else if(data->set.str[STRING_RTSP_SESSION_ID]) {
      /* If the Session ID is set, then compare */
      if(strncmp(start, data->set.str[STRING_RTSP_SESSION_ID],
                 strlen(data->set.str[STRING_RTSP_SESSION_ID]))  != 0) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then
         set it */

      /* The session ID can be an alphanumeric or a 'safe' character
       *
       * RFC 2326 15.1 Base Syntax:
       * safe =  "\$" | "-" | "_" | "." | "+"
       * */
      char *end = start;
      while(*end &&
            (ISALNUM(*end) || *end == '-' || *end == '_' || *end == '.' ||
             *end == '+' ||
             (*end == '\\' && *(end + 1) && *(end + 1) == '$' && (++end, 1))))
        end++;

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = malloc(end - start + 1);
      if(data->set.str[STRING_RTSP_SESSION_ID] == NULL)
        return CURLE_OUT_OF_MEMORY;
      memcpy(data->set.str[STRING_RTSP_SESSION_ID], start, end - start);
      (data->set.str[STRING_RTSP_SESSION_ID])[end - start] = '\0';
    }
  }
  return CURLE_OK;
}